

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

void __thiscall ElfFile::save(ElfFile *this,path *fileName)

{
  vector<ElfSegment_*,_std::allocator<ElfSegment_*>_> *pvVar1;
  pointer *pppEVar2;
  pointer *pppEVar3;
  ByteArray *this_00;
  Elf32_Half *pEVar4;
  pointer ppEVar5;
  pointer ppEVar6;
  Endianness endianness;
  pointer *pppEVar7;
  vector<ElfSection_*,_std::allocator<ElfSection_*>_> *pvVar8;
  ulong uVar9;
  size_t i;
  long lVar10;
  
  this_00 = &this->fileData;
  (this->fileData).size_ = 0;
  lVar10 = 0;
  ByteArray::reserveBytes(this_00,0x34,'\0');
  pvVar1 = &this->segments;
  pppEVar2 = &(this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  pppEVar3 = &(this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  do {
    switch(this->partsOrder[lVar10]) {
    case ELFPART_SEGMENTTABLE:
      ByteArray::alignSize(this_00,4);
      (this->fileHeader).e_phoff = (Elf32_Off)(this->fileData).size_;
      pEVar4 = &(this->fileHeader).e_phentsize;
      pppEVar7 = (pointer *)pppEVar2;
      pvVar8 = (vector<ElfSection_*,_std::allocator<ElfSection_*>_> *)pvVar1;
      goto LAB_00176e28;
    case ELFPART_SECTIONTABLE:
      ByteArray::alignSize(this_00,4);
      (this->fileHeader).e_shoff = (Elf32_Off)(this->fileData).size_;
      pEVar4 = &(this->fileHeader).e_shentsize;
      pppEVar7 = pppEVar3;
      pvVar8 = &this->sections;
LAB_00176e28:
      ByteArray::reserveBytes
                (this_00,(ulong)*pEVar4 *
                         ((long)*pppEVar7 -
                          (long)(pvVar8->
                                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 3),'\0');
      break;
    case ELFPART_SEGMENTS:
      ppEVar5 = (pvVar1->super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*pppEVar2 != ppEVar5) {
        uVar9 = 0;
        do {
          ElfSegment::writeData(ppEVar5[uVar9],this_00);
          uVar9 = uVar9 + 1;
          ppEVar5 = (pvVar1->super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)*pppEVar2 - (long)ppEVar5 >> 3));
      }
      break;
    case ELFPART_SEGMENTLESSSECTIONS:
      ppEVar6 = (this->segmentlessSections).
                super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->segmentlessSections).
          super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar6) {
        uVar9 = 0;
        do {
          ElfSection::writeData(ppEVar6[uVar9],this_00);
          uVar9 = uVar9 + 1;
          ppEVar6 = (this->segmentlessSections).
                    super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(this->segmentlessSections).
                                       super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar6 >>
                                3));
      }
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 4) {
      endianness = (Endianness)((this->fileHeader).e_ident[5] != '\x02');
      writeHeader(this,this_00,0,endianness);
      ppEVar5 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppEVar5) {
        uVar9 = 0;
        do {
          ElfSegment::writeHeader
                    (ppEVar5[uVar9],this_00,
                     (this->fileHeader).e_phentsize * uVar9 + (ulong)(this->fileHeader).e_phoff,
                     endianness);
          uVar9 = uVar9 + 1;
          ppEVar5 = (this->segments).super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(this->segments).
                                       super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >>
                                3));
      }
      ppEVar6 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (*pppEVar3 != ppEVar6) {
        uVar9 = 0;
        do {
          ElfSection::writeHeader
                    (ppEVar6[uVar9],this_00,
                     (this->fileHeader).e_shentsize * uVar9 + (ulong)(this->fileHeader).e_shoff,
                     endianness);
          uVar9 = uVar9 + 1;
          ppEVar6 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar9 < (ulong)((long)(this->sections).
                                       super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar6 >>
                                3));
      }
      ByteArray::toFile(this_00,fileName);
      return;
    }
  } while( true );
}

Assistant:

void ElfFile::save(const fs::path& fileName)
{
	fileData.clear();

	// reserve space for header and table data
	fileData.reserveBytes(sizeof(Elf32_Ehdr));

	for (size_t i = 0; i < 4; i++)
	{
		switch (partsOrder[i])
		{
		case ELFPART_SEGMENTTABLE:
			fileData.alignSize(4);
			fileHeader.e_phoff = (Elf32_Off) fileData.size();
			fileData.reserveBytes(segments.size()*fileHeader.e_phentsize);
			break;
		case ELFPART_SECTIONTABLE:
			fileData.alignSize(4);
			fileHeader.e_shoff = (Elf32_Off) fileData.size();
			fileData.reserveBytes(sections.size()*fileHeader.e_shentsize);
			break;
		case ELFPART_SEGMENTS:
			for (size_t i = 0; i < segments.size(); i++)
			{
				segments[i]->writeData(fileData);
			}
			break;
		case ELFPART_SEGMENTLESSSECTIONS:
			for (size_t i = 0; i < segmentlessSections.size(); i++)
			{
				segmentlessSections[i]->writeData(fileData);
			}
			break;
		}
	}

	// copy data to the tables
	Endianness endianness = getEndianness();
	writeHeader(fileData, 0, endianness);
	for (size_t i = 0; i < segments.size(); i++)
	{
		size_t pos = fileHeader.e_phoff+i*fileHeader.e_phentsize;
		segments[i]->writeHeader(fileData, pos, endianness);
	}
	
	for (size_t i = 0; i < sections.size(); i++)
	{
		size_t pos = fileHeader.e_shoff+i*fileHeader.e_shentsize;
		sections[i]->writeHeader(fileData, pos, endianness);
	}

	fileData.toFile(fileName);
}